

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void QtPromisePrivate::PromiseDispatch<float>::
     call<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>,std::function<float(QString_const&)>,QString_const&>
               (QPromiseResolve<float> *resolve,QPromiseReject<float> *reject,
               function<float_(const_QString_&)> *fn,QString *args)

{
  undefined8 uVar1;
  exception_ptr local_20;
  float local_14;
  
  if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) {
    uVar1 = std::__throw_bad_function_call();
    __cxa_begin_catch(uVar1);
    std::current_exception();
    PromiseResolver<float>::reject<std::__exception_ptr::exception_ptr>
              (&reject->m_resolver,&local_20);
    call<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>,std::function<float(QString_const&)>,QString_const&>
              ((PromiseDispatch<float> *)&local_20);
  }
  else {
    local_14 = (*fn->_M_invoker)((_Any_data *)fn,args);
    PromiseResolver<float>::resolve<float>(&resolve->m_resolver,&local_14);
  }
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }